

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O1

uint runcpsav(runcxdef *ctx,uchar **cp,objnum obj,prpnum prop)

{
  ushort uVar1;
  int iVar2;
  uchar *puVar3;
  undefined2 in_register_00000012;
  
  puVar3 = *cp;
  uVar1 = ctx->runcxmem->mcmcxmtb[CONCAT22(in_register_00000012,obj) >> 8][obj & 0xff];
  iVar2 = *(int *)((long)&ctx->runcxmem->mcmcxgl->mcmcxtab[uVar1 >> 8]->mcmoptr +
                  (ulong)((uVar1 & 0xff) << 5));
  *cp = (uchar *)0x0;
  mcmunlck(ctx->runcxmem,obj);
  return (int)puVar3 - iVar2;
}

Assistant:

static uint runcpsav(runcxdef *ctx, uchar *noreg *cp, objnum obj, prpnum prop)
{
    uint ofs;

    VARUSED(prop);
    
    /* get offset from start of object */
    ofs = *cp - mcmobjptr(ctx->runcxmem, (mcmon)obj);

    /* clear the pointer so the caller knows the object is unlocked */
    *cp = 0;

    /* unlock the object, and return the derived offset */
    mcmunlck(ctx->runcxmem, (mcmon)obj);
    return(ofs);
}